

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestValueTestoffsetAccessors::runTestCase(TestValueTestoffsetAccessors *this)

{
  size_t sVar1;
  Value x;
  Value y;
  Value z;
  Value VStack_88;
  Value local_60;
  Value local_38;
  
  Json::Value::Value(&VStack_88,nullValue);
  sVar1 = Json::Value::getOffsetStart(&VStack_88);
  if (sVar1 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5df,"x.getOffsetStart() == 0");
  }
  sVar1 = Json::Value::getOffsetLimit(&VStack_88);
  if (sVar1 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5e0,"x.getOffsetLimit() == 0");
  }
  Json::Value::setOffsetStart(&VStack_88,10);
  Json::Value::setOffsetLimit(&VStack_88,0x14);
  sVar1 = Json::Value::getOffsetStart(&VStack_88);
  if (sVar1 != 10) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5e3,"x.getOffsetStart() == 10");
  }
  sVar1 = Json::Value::getOffsetLimit(&VStack_88);
  if (sVar1 != 0x14) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5e4,"x.getOffsetLimit() == 20");
  }
  Json::Value::Value(&local_60,&VStack_88);
  sVar1 = Json::Value::getOffsetStart(&local_60);
  if (sVar1 != 10) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5e6,"y.getOffsetStart() == 10");
  }
  sVar1 = Json::Value::getOffsetLimit(&local_60);
  if (sVar1 != 0x14) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5e7,"y.getOffsetLimit() == 20");
  }
  Json::Value::Value(&local_38,nullValue);
  Json::Value::swap(&local_38,&local_60);
  sVar1 = Json::Value::getOffsetStart(&local_38);
  if (sVar1 != 10) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5ea,"z.getOffsetStart() == 10");
  }
  sVar1 = Json::Value::getOffsetLimit(&local_38);
  if (sVar1 != 0x14) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5eb,"z.getOffsetLimit() == 20");
  }
  sVar1 = Json::Value::getOffsetStart(&local_60);
  if (sVar1 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5ec,"y.getOffsetStart() == 0");
  }
  sVar1 = Json::Value::getOffsetLimit(&local_60);
  if (sVar1 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x5ed,"y.getOffsetLimit() == 0");
  }
  Json::Value::~Value(&local_38);
  Json::Value::~Value(&local_60);
  Json::Value::~Value(&VStack_88);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, offsetAccessors) {
  Json::Value x;
  JSONTEST_ASSERT(x.getOffsetStart() == 0);
  JSONTEST_ASSERT(x.getOffsetLimit() == 0);
  x.setOffsetStart(10);
  x.setOffsetLimit(20);
  JSONTEST_ASSERT(x.getOffsetStart() == 10);
  JSONTEST_ASSERT(x.getOffsetLimit() == 20);
  Json::Value y(x);
  JSONTEST_ASSERT(y.getOffsetStart() == 10);
  JSONTEST_ASSERT(y.getOffsetLimit() == 20);
  Json::Value z;
  z.swap(y);
  JSONTEST_ASSERT(z.getOffsetStart() == 10);
  JSONTEST_ASSERT(z.getOffsetLimit() == 20);
  JSONTEST_ASSERT(y.getOffsetStart() == 0);
  JSONTEST_ASSERT(y.getOffsetLimit() == 0);
}